

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall
TorController::add_onion_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  CService *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint16_t portDefault;
  long lVar2;
  pointer pbVar3;
  size_type sVar4;
  pointer pcVar5;
  DNSLookupFn dns_lookup_function;
  bool bVar6;
  Logger *pLVar7;
  iterator iVar8;
  CChainParams *pCVar9;
  char *this_01;
  TorController *pTVar10;
  pointer pbVar11;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  _Any_data local_a8;
  code *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code == 0x1fe) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_02._M_str = "add_onion_cb";
      logging_function_02._M_len = 0xc;
      ::LogPrintf_<>(logging_function_02,source_file_02,0x1c1,ALL,Info,
                     "tor: Add onion failed with unrecognized command (You probably need to upgrade Tor)\n"
                    );
      return;
    }
    goto LAB_00abe8af;
  }
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_03._M_len = 0x57;
      logging_function_03._M_str = "add_onion_cb";
      logging_function_03._M_len = 0xc;
      LogPrintf_<int>(logging_function_03,source_file_03,0x1c3,ALL,Info,
                      "tor: Add onion failed; error code %d\n",&reply->code);
      return;
    }
    goto LAB_00abe8af;
  }
  pLVar7 = LogInstance();
  bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar7,TOR,Debug);
  if (bVar6) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "add_onion_cb";
    logging_function._M_len = 0xc;
    ::LogPrintf_<>(logging_function,source_file,0x1a7,TOR,Debug,"ADD_ONION successful\n");
  }
  pbVar11 = (reply->lines).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != pbVar3) {
    paVar1 = &__str.field_2;
    in_stack_ffffffffffffff50 = &this->service_id;
    in_stack_ffffffffffffff48 = &this->private_key;
    do {
      ParseTorReplyMapping
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&m._M_t,pbVar11);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"ServiceID","");
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar8._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (in_stack_ffffffffffffff50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (iVar8._M_node + 2));
      }
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"PrivateKey","");
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar8._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (iVar8._M_node + 2));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar3);
  }
  sVar4 = (this->service_id)._M_string_length;
  if (sVar4 == 0) {
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_04._M_len = 0x57;
    logging_function_04._M_str = "add_onion_cb";
    logging_function_04._M_len = 0xc;
    ::LogPrintf_<>(logging_function_04,source_file_04,0x1b1,ALL,Info,
                   "tor: Error parsing ADD_ONION parameters:\n");
    pbVar11 = (reply->lines).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (reply->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar11 != pbVar3) {
      do {
        str._M_str = (pbVar11->_M_dataplus)._M_p;
        str._M_len = pbVar11->_M_string_length;
        SanitizeString_abi_cxx11_((string *)&m,str,0);
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_05._M_len = 0x57;
        logging_function_05._M_str = "add_onion_cb";
        logging_function_05._M_len = 0xc;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_05,source_file_05,0x1b3,ALL,Info,"    %s\n",(string *)&m);
        if ((_Base_ptr *)CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_) !=
            &m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((undefined1 *)CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_),
                          CONCAT44(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                   (size_type)
                                   m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar3);
    }
  }
  else {
    paVar1 = &__str.field_2;
    pcVar5 = (this->service_id)._M_dataplus._M_p;
    pTVar10 = this;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&__str,pcVar5,pcVar5 + sVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&__str,".onion");
    pCVar9 = Params();
    portDefault = pCVar9->nDefaultPort;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_a8,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_8_ = reply;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_function_pointer =
         (_func_void *)pTVar10;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff48;
    dns_lookup_function._M_invoker = (_Invoker_type)in_stack_ffffffffffffff50;
    LookupNumeric((CService *)&m,&__str,portDefault,dns_lookup_function);
    this_00 = &this->service;
    if (0x10 < (this->service).super_CNetAddr.m_addr._size) {
      free((this_00->super_CNetAddr).m_addr._union.indirect_contents.indirect);
    }
    *(undefined4 *)&(this_00->super_CNetAddr).m_addr._union = m._M_t._M_impl._0_4_;
    *(undefined4 *)((long)&(this->service).super_CNetAddr.m_addr._union + 4) = m._M_t._M_impl._4_4_;
    (this->service).super_CNetAddr.m_addr._union.indirect_contents.capacity =
         m._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    *(undefined4 *)((long)&(this->service).super_CNetAddr.m_addr._union + 0xc) =
         m._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
    (this->service).super_CNetAddr.m_addr._size =
         (size_type)m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
    *(_Base_ptr *)&(this->service).super_CNetAddr.m_net =
         m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->service).port = (uint16_t)m._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    CService::ToStringAddrPort_abi_cxx11_((string *)&m,this_00);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "add_onion_cb";
    logging_function_00._M_len = 0xc;
    this_01 = "add_onion_cb";
    ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function_00,source_file_00,0x1b8,ALL,Info,
               "Got tor service ID %s, advertising service %s\n",&this->service_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m);
    if ((_Base_ptr *)CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_) !=
        &m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      this_01 = (char *)(CONCAT44(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                  (size_type)
                                  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) + 1);
      operator_delete((undefined1 *)CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_),
                      (ulong)this_01);
    }
    GetPrivateKeyFile((path *)&m,(TorController *)this_01);
    pTVar10 = (TorController *)&this->private_key;
    bVar6 = WriteBinaryFile((path *)&m,(string *)pTVar10);
    std::filesystem::__cxx11::path::~path((path *)&m);
    if (bVar6) {
      pLVar7 = LogInstance();
      pTVar10 = (TorController *)0x2;
      bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar7,TOR,Debug);
      if (bVar6) {
        GetPrivateKeyFile((path *)&m,pTVar10);
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__str,CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_),
                   CONCAT44(m._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                            m._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
                   CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_));
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_01._M_len = 0x57;
        logging_function_01._M_str = "add_onion_cb";
        logging_function_01._M_len = 0xc;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_01,source_file_01,0x1ba,TOR,Debug,
                   "Cached service private key to %s\n",&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00abe723;
      }
    }
    else {
      GetPrivateKeyFile((path *)&m,pTVar10);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_),
                 CONCAT44(m._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                          m._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
                 CONCAT44(m._M_t._M_impl._4_4_,m._M_t._M_impl._0_4_));
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_06._M_len = 0x57;
      logging_function_06._M_str = "add_onion_cb";
      logging_function_06._M_len = 0xc;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_06,source_file_06,0x1bc,ALL,Info,
                 "tor: Error writing service private key to %s\n",&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
LAB_00abe723:
      std::filesystem::__cxx11::path::~path((path *)&m);
    }
    AddLocal(this_00,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00abe8af:
  __stack_chk_fail();
}

Assistant:

void TorController::add_onion_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "ADD_ONION successful\n");
        for (const std::string &s : reply.lines) {
            std::map<std::string,std::string> m = ParseTorReplyMapping(s);
            std::map<std::string,std::string>::iterator i;
            if ((i = m.find("ServiceID")) != m.end())
                service_id = i->second;
            if ((i = m.find("PrivateKey")) != m.end())
                private_key = i->second;
        }
        if (service_id.empty()) {
            LogPrintf("tor: Error parsing ADD_ONION parameters:\n");
            for (const std::string &s : reply.lines) {
                LogPrintf("    %s\n", SanitizeString(s));
            }
            return;
        }
        service = LookupNumeric(std::string(service_id+".onion"), Params().GetDefaultPort());
        LogInfo("Got tor service ID %s, advertising service %s\n", service_id, service.ToStringAddrPort());
        if (WriteBinaryFile(GetPrivateKeyFile(), private_key)) {
            LogDebug(BCLog::TOR, "Cached service private key to %s\n", fs::PathToString(GetPrivateKeyFile()));
        } else {
            LogPrintf("tor: Error writing service private key to %s\n", fs::PathToString(GetPrivateKeyFile()));
        }
        AddLocal(service, LOCAL_MANUAL);
        // ... onion requested - keep connection open
    } else if (reply.code == 510) { // 510 Unrecognized command
        LogPrintf("tor: Add onion failed with unrecognized command (You probably need to upgrade Tor)\n");
    } else {
        LogPrintf("tor: Add onion failed; error code %d\n", reply.code);
    }
}